

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NewFrame(void)

{
  ImVector<ImGuiKeyRoutingData> *this;
  ImS8 *pIVar1;
  ImVector<ImGuiContextHook> *this_00;
  ImVec2 *pIVar2;
  float *pfVar3;
  short *psVar4;
  undefined8 uVar5;
  ImGuiNavLayer IVar6;
  ImGuiContextHook *pIVar7;
  ImGuiViewportP *pIVar8;
  ImGuiKeyRoutingData *pIVar9;
  ImGuiTableTempData *pIVar10;
  ImGuiStackLevelInfo *pIVar11;
  ImGuiScrollFlags scroll_flags;
  undefined1 auVar12 [12];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [12];
  undefined1 auVar16 [16];
  ImGuiContext *ctx;
  ImGuiContext *pIVar17;
  ImGuiContext *pIVar18;
  undefined3 uVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  ImU8 IVar23;
  int n_2;
  ImGuiID IVar24;
  ImGuiKeyChord IVar25;
  ImGuiInputSource IVar26;
  ImGuiInputSource extraout_EAX;
  ImGuiNavLayer IVar27;
  undefined4 uVar28;
  ImFont *font;
  ImGuiKeyData *pIVar29;
  bool *pbVar30;
  long lVar31;
  ImGuiKeyOwnerData *pIVar32;
  ImGuiWindow *pIVar33;
  ImRect *pIVar34;
  int n_3;
  int iVar35;
  undefined4 uVar36;
  ImGuiID IVar37;
  long lVar38;
  ulong uVar39;
  ImGuiWindow *pIVar40;
  ImGuiWindow *window;
  bool bVar41;
  undefined2 uVar42;
  ImGuiContext *g;
  long lVar43;
  bool *pbVar44;
  byte bVar45;
  uint uVar46;
  char *pcVar47;
  ulong uVar48;
  ImGui *this_01;
  long lVar49;
  byte bVar50;
  ImGuiKey key;
  ImGuiKeyRoutingData *pIVar51;
  ImGuiKeyRoutingData *v;
  ImGuiWindow *child_window;
  ImGuiWindow *parent_window;
  ImGuiContext *pIVar52;
  bool bVar53;
  uint uVar54;
  uint uVar55;
  int iVar56;
  float fVar57;
  int iVar63;
  ImVec2 IVar58;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  ImVec2 IVar59;
  ImVec2 IVar60;
  ImVec2 IVar61;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar62 [16];
  float fVar64;
  ImVec2 IVar65;
  undefined1 auVar66 [16];
  float fVar68;
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar73;
  ImRect IVar74;
  float local_d8;
  float local_b8;
  float fStack_b4;
  undefined1 local_98 [8];
  ImVec2 IStack_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  float local_58;
  float fStack_54;
  ImRect local_48;
  ImGuiWindow *local_38;
  
  ctx = GImGui;
  this_00 = &GImGui->Hooks;
  uVar39 = (ulong)(uint)(GImGui->Hooks).Size;
  lVar43 = uVar39 << 5;
  while( true ) {
    if ((int)uVar39 < 1) break;
    pIVar7 = (ctx->Hooks).Data;
    if (*(int *)(pIVar7 + lVar43 + -0x1c) == 7) {
      ImVector<ImGuiContextHook>::erase(this_00,pIVar7 + lVar43 + -0x20);
    }
    uVar39 = (ulong)((int)uVar39 - 1);
    lVar43 = lVar43 + -0x20;
  }
  CallContextHooks(ctx,ImGuiContextHookType_NewFramePre);
  pIVar52 = GImGui;
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar52->SettingsLoaded == false) {
    pcVar47 = (pIVar52->IO).IniFilename;
    if (pcVar47 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar47);
    }
    pIVar52->SettingsLoaded = true;
  }
  if ((0.0 < pIVar52->SettingsDirtyTimer) &&
     (IVar60.x = pIVar52->SettingsDirtyTimer - (pIVar52->IO).DeltaTime,
     pIVar52->SettingsDirtyTimer = IVar60.x, IVar60.x <= 0.0)) {
    pcVar47 = (pIVar52->IO).IniFilename;
    if (pcVar47 == (char *)0x0) {
      (pIVar52->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar47);
    }
    pIVar52->SettingsDirtyTimer = 0.0;
  }
  ctx->Time = (double)(ctx->IO).DeltaTime + ctx->Time;
  ctx->WithinFrameScope = true;
  ctx->FrameCount = ctx->FrameCount + 1;
  ctx->TooltipOverrideCount = 0;
  ctx->WindowsActiveCount = 0;
  lVar43 = 0;
  ImVector<unsigned_int>::resize(&ctx->MenusIdSubmittedThisFrame,0);
  IVar60.x = (ctx->IO).DeltaTime;
  ctx->FramerateSecPerFrameAccum =
       (IVar60.x - ctx->FramerateSecPerFrame[ctx->FramerateSecPerFrameIdx]) +
       ctx->FramerateSecPerFrameAccum;
  ctx->FramerateSecPerFrame[ctx->FramerateSecPerFrameIdx] = IVar60.x;
  iVar35 = 0x3b;
  if (ctx->FramerateSecPerFrameCount < 0x3b) {
    iVar35 = ctx->FramerateSecPerFrameCount;
  }
  ctx->FramerateSecPerFrameIdx = (ctx->FramerateSecPerFrameIdx + 1) % 0x3c;
  ctx->FramerateSecPerFrameCount = iVar35 + 1;
  uVar54 = -(uint)(0.0 < ctx->FramerateSecPerFrameAccum);
  (ctx->IO).Framerate =
       (float)(~uVar54 & 0x7f7fffff |
              (uint)(1.0 / (ctx->FramerateSecPerFrameAccum / (float)(iVar35 + 1))) & uVar54);
  pIVar52 = GImGui;
  pIVar8 = *(GImGui->Viewports).Data;
  (pIVar8->super_ImGuiViewport).Flags = 5;
  (pIVar8->super_ImGuiViewport).Pos.x = 0.0;
  (pIVar8->super_ImGuiViewport).Pos.y = 0.0;
  (pIVar8->super_ImGuiViewport).Size = (pIVar52->IO).DisplaySize;
  for (; lVar43 < (pIVar52->Viewports).Size; lVar43 = lVar43 + 1) {
    pIVar8 = (pIVar52->Viewports).Data[lVar43];
    pIVar8->WorkOffsetMin = pIVar8->BuildWorkOffsetMin;
    pIVar8->WorkOffsetMax = pIVar8->BuildWorkOffsetMax;
    (pIVar8->BuildWorkOffsetMin).x = 0.0;
    (pIVar8->BuildWorkOffsetMin).y = 0.0;
    (pIVar8->BuildWorkOffsetMax).x = 0.0;
    (pIVar8->BuildWorkOffsetMax).y = 0.0;
    ImGuiViewportP::UpdateWorkRect(pIVar8);
  }
  ((ctx->IO).Fonts)->Locked = true;
  font = GetDefaultFont();
  SetCurrentFont(font);
  fVar64 = 3.4028235e+38;
  fVar68 = 3.4028235e+38;
  fVar57 = -3.4028235e+38;
  IVar60.x = -3.4028235e+38;
  for (lVar43 = 0; lVar43 < (ctx->Viewports).Size; lVar43 = lVar43 + 1) {
    IVar74 = ImGuiViewportP::GetMainRect((ctx->Viewports).Data[lVar43]);
    fVar73 = IVar74.Min.x;
    if (fVar64 <= IVar74.Min.x) {
      fVar73 = fVar64;
    }
    fVar64 = fVar73;
    fVar73 = IVar74.Min.y;
    if (fVar68 <= IVar74.Min.y) {
      fVar73 = fVar68;
    }
    fVar68 = fVar73;
    fVar73 = IVar74.Max.x;
    if (IVar74.Max.x <= fVar57) {
      fVar73 = fVar57;
    }
    fVar57 = fVar73;
    if (IVar60.x < IVar74.Max.y) {
      IVar60.x = IVar74.Max.y;
    }
  }
  (ctx->DrawListSharedData).ClipRectFullscreen.x = fVar64;
  (ctx->DrawListSharedData).ClipRectFullscreen.y = fVar68;
  (ctx->DrawListSharedData).ClipRectFullscreen.z = fVar57;
  (ctx->DrawListSharedData).ClipRectFullscreen.w = IVar60.x;
  IVar60.x = (ctx->Style).CircleTessellationMaxError;
  (ctx->DrawListSharedData).CurveTessellationTol = (ctx->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleTessellationMaxError(&ctx->DrawListSharedData,IVar60.x);
  bVar41 = (ctx->Style).AntiAliasedLines;
  uVar54 = (uint)bVar41;
  (ctx->DrawListSharedData).InitialFlags = (uint)bVar41;
  if (((ctx->Style).AntiAliasedLinesUseTex != false) &&
     ((ctx->Font->ContainerAtlas->Flags & 4) == 0)) {
    uVar54 = bVar41 | 2;
    (ctx->DrawListSharedData).InitialFlags = uVar54;
  }
  if ((ctx->Style).AntiAliasedFill == true) {
    uVar54 = uVar54 | 4;
    (ctx->DrawListSharedData).InitialFlags = uVar54;
  }
  if (((ctx->IO).BackendFlags & 8) != 0) {
    (ctx->DrawListSharedData).InitialFlags = uVar54 | 8;
  }
  for (lVar43 = 0; lVar43 < (ctx->Viewports).Size; lVar43 = lVar43 + 1) {
    pIVar8 = (ctx->Viewports).Data[lVar43];
    (pIVar8->DrawDataP).DisplaySize.x = 0.0;
    (pIVar8->DrawDataP).DisplaySize.y = 0.0;
    (pIVar8->DrawDataP).FramebufferScale.x = 0.0;
    (pIVar8->DrawDataP).FramebufferScale.y = 0.0;
    (pIVar8->DrawDataP).CmdLists = (ImDrawList **)0x0;
    (pIVar8->DrawDataP).DisplayPos.x = 0.0;
    (pIVar8->DrawDataP).DisplayPos.y = 0.0;
    (pIVar8->DrawDataP).Valid = false;
    *(undefined3 *)&(pIVar8->DrawDataP).field_0x1 = 0;
    (pIVar8->DrawDataP).CmdListsCount = 0;
    (pIVar8->DrawDataP).TotalIdxCount = 0;
    (pIVar8->DrawDataP).TotalVtxCount = 0;
  }
  if ((ctx->DragDropActive != false) &&
     (IVar24 = (ctx->DragDropPayload).SourceId, IVar24 == ctx->ActiveId)) {
    KeepAliveID(IVar24);
  }
  if (ctx->HoveredIdPreviousFrame == 0) {
    IVar24 = ctx->HoveredId;
    ctx->HoveredIdTimer = 0.0;
    ctx->HoveredIdNotActiveTimer = 0.0;
    if (IVar24 == 0) goto LAB_001be359;
LAB_001be31a:
    IVar60.x = (ctx->IO).DeltaTime;
    ctx->HoveredIdTimer = ctx->HoveredIdTimer + IVar60.x;
    if (ctx->ActiveId != IVar24) {
      ctx->HoveredIdNotActiveTimer = IVar60.x + ctx->HoveredIdNotActiveTimer;
    }
  }
  else {
    IVar24 = ctx->HoveredId;
    if (IVar24 != 0) {
      if (ctx->ActiveId == IVar24) {
        ctx->HoveredIdNotActiveTimer = 0.0;
      }
      goto LAB_001be31a;
    }
LAB_001be359:
    IVar24 = 0;
  }
  ctx->HoveredIdPreviousFrame = IVar24;
  ctx->HoveredId = 0;
  ctx->HoveredIdAllowOverlap = false;
  ctx->HoveredIdDisabled = false;
  IVar24 = ctx->ActiveId;
  if (IVar24 == 0) {
    IVar60.x = (ctx->IO).DeltaTime;
LAB_001be3f1:
    IVar24 = 0;
  }
  else {
    if ((ctx->ActiveIdIsAlive == IVar24) || (ctx->ActiveIdPreviousFrame != IVar24)) {
      IVar60.x = (ctx->IO).DeltaTime;
    }
    else {
      if ((ctx->DebugLogFlags & 1) != 0) {
        DebugLog("NewFrame(): ClearActiveID() because it isn\'t marked alive anymore!\n");
      }
      ClearActiveID();
      IVar24 = ctx->ActiveId;
      IVar60.x = (ctx->IO).DeltaTime;
      if (IVar24 == 0) goto LAB_001be3f1;
    }
    ctx->ActiveIdTimer = ctx->ActiveIdTimer + IVar60.x;
  }
  ctx->LastActiveIdTimer = IVar60.x + ctx->LastActiveIdTimer;
  ctx->ActiveIdPreviousFrame = IVar24;
  ctx->ActiveIdPreviousFrameWindow = ctx->ActiveIdWindow;
  ctx->ActiveIdPreviousFrameHasBeenEditedBefore = ctx->ActiveIdHasBeenEditedBefore;
  ctx->ActiveIdIsAlive = 0;
  ctx->ActiveIdHasBeenEditedThisFrame = false;
  ctx->ActiveIdPreviousFrameIsAlive = false;
  ctx->ActiveIdIsJustActivated = false;
  if (IVar24 != ctx->TempInputId && ctx->TempInputId != 0) {
    ctx->TempInputId = 0;
  }
  if (IVar24 == 0) {
    ctx->ActiveIdUsingNavDirMask = 0;
    ctx->ActiveIdUsingAllKeyboardKeys = false;
    ctx->ActiveIdUsingNavInputMask = 0;
  }
  else if ((ctx->ActiveIdUsingNavInputMask & 2) != 0) {
    SetKeyOwner(ImGuiKey_Escape,IVar24,0);
  }
  ctx->HoverDelayIdPreviousFrame = ctx->HoverDelayId;
  if (ctx->HoverDelayId == 0) {
    if (0.0 < ctx->HoverDelayTimer) {
      IVar60.x = (ctx->IO).DeltaTime;
      fVar68 = ctx->HoverDelayClearTimer + IVar60.x;
      ctx->HoverDelayClearTimer = fVar68;
      fVar64 = 0.2;
      if (0.2 <= IVar60.x + IVar60.x) {
        fVar64 = IVar60.x + IVar60.x;
      }
      if (fVar64 <= fVar68) {
        ctx->HoverDelayTimer = 0.0;
        ctx->HoverDelayClearTimer = 0.0;
      }
    }
  }
  else {
    ctx->HoverDelayTimer = (ctx->IO).DeltaTime + ctx->HoverDelayTimer;
    ctx->HoverDelayClearTimer = 0.0;
    ctx->HoverDelayId = 0;
  }
  ctx->DragDropAcceptIdPrev = ctx->DragDropAcceptIdCurr;
  ctx->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  ctx->DragDropAcceptIdCurr = 0;
  ctx->DragDropWithinSource = false;
  ctx->DragDropWithinTarget = false;
  ctx->DragDropHoldJustPressedId = 0;
  ImVector<ImGuiInputEvent>::resize(&ctx->InputEventsTrail,0);
  UpdateInputEvents((ctx->IO).ConfigInputTrickleEventQueue);
  pIVar52 = GImGui;
  if ((GImGui->IO).BackendUsingLegacyKeyArrays != '\0') {
    for (lVar43 = 0; lVar43 != 0x8c; lVar43 = lVar43 + 1) {
      lVar38 = (long)(pIVar52->IO).KeyMap[lVar43 + 0x200];
      if (lVar38 != -1) {
        (pIVar52->IO).KeyMap[lVar38] = (int)lVar43 + 0x200;
      }
    }
    for (uVar39 = 0; uVar39 != 0x200; uVar39 = uVar39 + 1) {
      bVar41 = (pIVar52->IO).KeysDown[uVar39];
      if ((bVar41 != false) || ((pIVar52->IO).BackendUsingLegacyKeyArrays == '\x01')) {
        uVar54 = (pIVar52->IO).KeyMap[uVar39];
        uVar48 = uVar39 & 0xffffffff;
        if (uVar54 != 0xffffffff) {
          uVar48 = (ulong)uVar54;
        }
        (pIVar52->IO).KeysData[(int)uVar48].Down = bVar41;
        if (uVar39 != uVar48) {
          (pIVar52->IO).KeysDown[(int)uVar48] = (pIVar52->IO).KeysDown[uVar39];
        }
        (pIVar52->IO).BackendUsingLegacyKeyArrays = '\x01';
      }
    }
    if ((pIVar52->IO).BackendUsingLegacyKeyArrays == '\x01') {
      bVar41 = (pIVar52->IO).KeyCtrl;
      pIVar29 = GetKeyData(ImGuiKey_ModCtrl);
      pIVar29->Down = bVar41;
      bVar41 = (pIVar52->IO).KeyShift;
      pIVar29 = GetKeyData(ImGuiKey_ModShift);
      pIVar29->Down = bVar41;
      bVar41 = (pIVar52->IO).KeyAlt;
      pIVar29 = GetKeyData(ImGuiKey_ModAlt);
      pIVar29->Down = bVar41;
      bVar41 = (pIVar52->IO).KeySuper;
      pIVar29 = GetKeyData(ImGuiKey_ModSuper);
      pIVar29->Down = bVar41;
    }
  }
  if (((((pIVar52->IO).ConfigFlags & 2) != 0) &&
      ((pIVar52->IO).BackendUsingLegacyNavInputArray == true)) &&
     (((pIVar52->IO).BackendFlags & 1U) != 0)) {
    IVar60.x = (pIVar52->IO).NavInputs[0];
    fVar64 = (pIVar52->IO).NavInputs[1];
    (pIVar52->IO).KeysData[0x26e].Down = 0.0 < IVar60.x;
    (pIVar52->IO).KeysData[0x26e].AnalogValue = IVar60.x;
    (pIVar52->IO).KeysData[0x26c].Down = 0.0 < fVar64;
    (pIVar52->IO).KeysData[0x26c].AnalogValue = fVar64;
    IVar60.x = (pIVar52->IO).NavInputs[3];
    (pIVar52->IO).KeysData[0x26b].Down = 0.0 < IVar60.x;
    (pIVar52->IO).KeysData[0x26b].AnalogValue = IVar60.x;
    IVar60.x = (pIVar52->IO).NavInputs[2];
    (pIVar52->IO).KeysData[0x26d].Down = 0.0 < IVar60.x;
    (pIVar52->IO).KeysData[0x26d].AnalogValue = IVar60.x;
    IVar60.x = (pIVar52->IO).NavInputs[4];
    (pIVar52->IO).KeysData[0x26f].Down = 0.0 < IVar60.x;
    (pIVar52->IO).KeysData[0x26f].AnalogValue = IVar60.x;
    IVar60.x = (pIVar52->IO).NavInputs[5];
    (pIVar52->IO).KeysData[0x270].Down = 0.0 < IVar60.x;
    (pIVar52->IO).KeysData[0x270].AnalogValue = IVar60.x;
    IVar60.x = (pIVar52->IO).NavInputs[6];
    (pIVar52->IO).KeysData[0x271].Down = 0.0 < IVar60.x;
    (pIVar52->IO).KeysData[0x271].AnalogValue = IVar60.x;
    IVar60.x = (pIVar52->IO).NavInputs[7];
    fVar64 = (pIVar52->IO).NavInputs[8];
    (pIVar52->IO).KeysData[0x272].Down = 0.0 < IVar60.x;
    (pIVar52->IO).KeysData[0x272].AnalogValue = IVar60.x;
    IVar60.x = (pIVar52->IO).NavInputs[0xc];
    fVar68 = (pIVar52->IO).NavInputs[0xe];
    (pIVar52->IO).KeysData[0x273].Down = (bool)((-(0.0 < fVar68) | -(0.0 < IVar60.x)) & 1);
    (pIVar52->IO).KeysData[0x273].AnalogValue =
         (float)(~-(uint)(fVar68 <= IVar60.x) & (uint)fVar68 |
                (uint)IVar60.x & -(uint)(fVar68 <= IVar60.x));
    IVar60.x = (pIVar52->IO).NavInputs[0xd];
    fVar68 = (pIVar52->IO).NavInputs[0xf];
    (pIVar52->IO).KeysData[0x274].Down = (bool)(-(0.0 < IVar60.x || 0.0 < fVar68) & 1);
    (pIVar52->IO).KeysData[0x274].AnalogValue =
         (float)(~-(uint)(fVar68 <= IVar60.x) & (uint)fVar68 |
                (uint)IVar60.x & -(uint)(fVar68 <= IVar60.x));
    (pIVar52->IO).KeysData[0x279].Down = 0.0 < fVar64;
    (pIVar52->IO).KeysData[0x279].AnalogValue = fVar64;
    IVar60.x = (pIVar52->IO).NavInputs[9];
    (pIVar52->IO).KeysData[0x27a].Down = 0.0 < IVar60.x;
    (pIVar52->IO).KeysData[0x27a].AnalogValue = IVar60.x;
    IVar60.x = (pIVar52->IO).NavInputs[10];
    fVar64 = (pIVar52->IO).NavInputs[0xb];
    (pIVar52->IO).KeysData[0x27b].Down = 0.0 < IVar60.x;
    (pIVar52->IO).KeysData[0x27b].AnalogValue = IVar60.x;
    (pIVar52->IO).KeysData[0x27c].Down = 0.0 < fVar64;
    (pIVar52->IO).KeysData[0x27c].AnalogValue = fVar64;
  }
  IVar25 = GetMergedModsFromBools();
  (pIVar52->IO).KeyMods = IVar25;
  for (lVar43 = 0; lVar43 != 5; lVar43 = lVar43 + 1) {
    bVar41 = (pIVar52->IO).MouseDown[lVar43];
    IVar60.x = 1.0;
    if (bVar41 == false) {
      IVar60.x = 0.0;
    }
    UpdateAliasKey((int)lVar43 + ImGuiKey_MouseLeft,bVar41,IVar60.x);
  }
  IVar60.x = (pIVar52->IO).MouseWheelH;
  UpdateAliasKey(ImGuiKey_MouseWheelX,(bool)(-(IVar60.x != 0.0) & 1),IVar60.x);
  IVar60.x = (pIVar52->IO).MouseWheel;
  UpdateAliasKey(ImGuiKey_MouseWheelY,(bool)(-(IVar60.x != 0.0) & 1),IVar60.x);
  if (((pIVar52->IO).BackendFlags & 1) == 0) {
    for (lVar43 = 0; lVar43 != 0x180; lVar43 = lVar43 + 0x10) {
      (&(pIVar52->IO).KeysData[0x269].Down)[lVar43] = false;
      *(undefined4 *)((long)&(pIVar52->IO).KeysData[0x269].AnalogValue + lVar43) = 0;
    }
  }
  for (lVar43 = 0xe24; lVar43 != 0x36e4; lVar43 = lVar43 + 0x10) {
    IVar60.x = *(float *)((long)pIVar52 + lVar43 + -4);
    *(float *)(&pIVar52->Initialized + lVar43) = IVar60.x;
    fVar64 = -1.0;
    if ((*(char *)((long)pIVar52 + lVar43 + -8) == '\x01') && (fVar64 = 0.0, 0.0 <= IVar60.x)) {
      fVar64 = IVar60.x + (pIVar52->IO).DeltaTime;
    }
    *(float *)((long)pIVar52 + lVar43 + -4) = fVar64;
  }
  pbVar30 = &pIVar52->KeysOwnerData[0].LockUntilRelease;
  for (lVar43 = 0; pIVar17 = GImGui, lVar43 != 0x8c0; lVar43 = lVar43 + 0x10) {
    ((ImGuiKeyOwnerData *)(pbVar30 + -9))->OwnerCurr = *(ImGuiID *)(pbVar30 + -5);
    if ((&(pIVar52->IO).KeysData[0x200].Down)[lVar43] == false) {
      *(ImGuiID *)(pbVar30 + -5) = 0xffffffff;
    }
    if (*pbVar30 == true) {
      bVar41 = (&(pIVar52->IO).KeysData[0x200].Down)[lVar43];
    }
    else {
      bVar41 = false;
    }
    *pbVar30 = bVar41;
    pbVar30[-1] = bVar41;
    pbVar30 = pbVar30 + 0xc;
  }
  this = &(pIVar52->KeysRoutingTable).EntriesNext;
  ImVector<ImGuiKeyRoutingData>::resize(this,0);
  for (lVar43 = 0x200; lVar43 != 0x28c; lVar43 = lVar43 + 1) {
    iVar35 = this->Size;
    lVar38 = (long)iVar35;
    pIVar51 = (ImGuiKeyRoutingData *)(&pIVar52->KeysOwnerData[0x36].LockThisFrame + lVar43 * 2);
    v = pIVar51;
    while (lVar31 = (long)v->NextEntryIndex, lVar31 != -1) {
      pIVar9 = (pIVar52->KeysRoutingTable).Entries.Data;
      IVar24 = pIVar9[lVar31].RoutingNext;
      pIVar9[lVar31].RoutingCurr = IVar24;
      pIVar9[lVar31].RoutingNext = 0xffffffff;
      v = pIVar9 + lVar31;
      pIVar9[lVar31].RoutingNextScore = 0xff;
      if (((IVar24 != 0xffffffff) &&
          (ImVector<ImGuiKeyRoutingData>::push_back(this,v), (pIVar17->IO).KeyMods == (uint)v->Mods)
          ) && (pIVar32 = GetKeyOwnerData((ImGuiKey)lVar43), pIVar32->OwnerCurr == 0xffffffff)) {
        pIVar32->OwnerCurr = v->RoutingCurr;
      }
    }
    iVar56 = 0xffff;
    if (iVar35 < this->Size) {
      iVar56 = iVar35;
    }
    pIVar51->NextEntryIndex = (ImGuiKeyRoutingIndex)iVar56;
    lVar31 = lVar38 << 4;
    while( true ) {
      iVar35 = iVar35 + 1;
      if (this->Size <= lVar38) break;
      lVar38 = lVar38 + 1;
      uVar42 = 0xffff;
      if (lVar38 < this->Size) {
        uVar42 = (undefined2)iVar35;
      }
      *(undefined2 *)
       ((long)&((pIVar52->KeysRoutingTable).EntriesNext.Data)->NextEntryIndex + lVar31) = uVar42;
      lVar31 = lVar31 + 0x10;
    }
  }
  this_01 = (ImGui *)&(pIVar52->KeysRoutingTable).Entries;
  ImVector<ImGuiKeyRoutingData>::swap((ImVector<ImGuiKeyRoutingData> *)this_01,this);
  pIVar52 = GImGui;
  (GImGui->IO).WantSetMousePos = false;
  uVar54 = (pIVar52->IO).ConfigFlags;
  if (((uVar54 & 2) == 0) || (((pIVar52->IO).BackendFlags & 1) == 0)) {
    bVar45 = 0;
  }
  else {
    for (lVar43 = 0; lVar43 != 0x20; lVar43 = lVar43 + 4) {
      this_01 = (ImGui *)(ulong)*(ImGuiKey *)((long)&DAT_00227580 + lVar43);
      bVar41 = IsKeyDown(*(ImGuiKey *)((long)&DAT_00227580 + lVar43));
      if (bVar41) {
        pIVar52->NavInputSource = ImGuiInputSource_Gamepad;
      }
    }
    uVar54 = (pIVar52->IO).ConfigFlags;
    bVar45 = 1;
  }
  if ((uVar54 & 1) != 0) {
    for (lVar43 = 0; lVar43 != 0x1c; lVar43 = lVar43 + 4) {
      this_01 = (ImGui *)(ulong)*(ImGuiKey *)((long)&DAT_00224c10 + lVar43);
      bVar41 = IsKeyDown(*(ImGuiKey *)((long)&DAT_00224c10 + lVar43));
      if (bVar41) {
        pIVar52->NavInputSource = ImGuiInputSource_Keyboard;
      }
    }
  }
  if (pIVar52->NavInitResultId != 0) {
    NavInitRequestApplyResult();
  }
  pIVar52->NavInitRequest = false;
  pIVar52->NavInitRequestFromMove = false;
  pIVar52->NavInitResultId = 0;
  pIVar52->NavJustMovedToId = 0;
  if (pIVar52->NavMoveSubmitted == true) {
    NavMoveRequestApplyResult(this_01);
  }
  pIVar52->NavTabbingCounter = 0;
  pIVar52->NavMoveSubmitted = false;
  pIVar52->NavMoveScoringItems = false;
  if ((((pIVar52->NavMousePosDirty == true) && (pIVar52->NavIdIsAlive == true)) &&
      (pIVar52->NavDisableHighlight == false)) && (pIVar52->NavDisableMouseHover == true)) {
    bVar41 = pIVar52->NavWindow != (ImGuiWindow *)0x0;
  }
  else {
    bVar41 = false;
  }
  pIVar52->NavMousePosDirty = false;
  pIVar33 = pIVar52->NavWindow;
  pIVar40 = pIVar33;
  if (pIVar33 != (ImGuiWindow *)0x0) {
    for (; pIVar40 != (ImGuiWindow *)0x0; pIVar40 = pIVar40->ParentWindow) {
      if ((pIVar40->RootWindow == pIVar40) || ((pIVar40->Flags & 0x14000000) != 0)) {
        if (pIVar40 != pIVar33) {
          pIVar40->NavLastChildNavWindow = pIVar33;
          pIVar33 = pIVar52->NavWindow;
        }
        break;
      }
    }
    if (((pIVar33 != (ImGuiWindow *)0x0) && (pIVar33->NavLastChildNavWindow != (ImGuiWindow *)0x0))
       && (pIVar52->NavLayer == ImGuiNavLayer_Main)) {
      pIVar33->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar17 = GImGui;
  pIVar33 = GetTopMostPopupModal();
  if (pIVar33 != (ImGuiWindow *)0x0) {
    pIVar17->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar17->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (pIVar17->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    IVar60.x = (pIVar17->IO).DeltaTime * -10.0 + pIVar17->NavWindowingHighlightAlpha;
    IVar60.x = (float)(-(uint)(0.0 <= IVar60.x) & (uint)IVar60.x);
    pIVar17->NavWindowingHighlightAlpha = IVar60.x;
    if ((pIVar17->DimBgRatio <= 0.0) && (IVar60.x <= 0.0)) {
      pIVar17->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  local_88 = (float)(pIVar17->IO).ConfigFlags;
  bVar53 = true;
  if (((uint)local_88 & 2) != 0) {
    bVar53 = ((pIVar17->IO).BackendFlags & 1) == 0;
  }
  bVar22 = false;
  bVar20 = false;
  bVar21 = false;
  bVar50 = 0;
  if (pIVar33 == (ImGuiWindow *)0x0) {
    if (pIVar17->ConfigNavWindowingKeyNext == 0) {
      bVar20 = false;
    }
    else {
      bVar20 = Shortcut(pIVar17->ConfigNavWindowingKeyNext,0xffffffff,0x1001);
    }
    if (pIVar17->ConfigNavWindowingKeyPrev == 0) {
      bVar21 = false;
    }
    else {
      bVar21 = Shortcut(pIVar17->ConfigNavWindowingKeyPrev,0xffffffff,0x1001);
    }
    if ((bVar53) || (pIVar17->NavWindowingTarget != (ImGuiWindow *)0x0)) {
      bVar22 = false;
    }
    else {
      bVar22 = IsKeyPressed(ImGuiKey_GamepadFaceLeft,0,0);
    }
    bVar50 = (bVar20 | bVar21) & pIVar17->NavWindowingTarget == (ImGuiWindow *)0x0;
  }
  if (((bVar22 != false) || (bVar50 != 0)) &&
     ((pIVar33 = pIVar17->NavWindow, pIVar33 != (ImGuiWindow *)0x0 ||
      (pIVar33 = FindWindowNavFocusable((pIVar17->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
      pIVar33 != (ImGuiWindow *)0x0)))) {
    pIVar33 = pIVar33->RootWindow;
    pIVar17->NavWindowingTargetAnim = pIVar33;
    pIVar17->NavWindowingTarget = pIVar33;
    pIVar17->NavWindowingTimer = 0.0;
    pIVar17->NavWindowingHighlightAlpha = 0.0;
    (pIVar17->NavWindowingAccumDeltaPos).x = 0.0;
    (pIVar17->NavWindowingAccumDeltaPos).y = 0.0;
    (pIVar17->NavWindowingAccumDeltaSize).x = 0.0;
    (pIVar17->NavWindowingAccumDeltaSize).y = 0.0;
    pIVar17->NavWindowingToggleLayer = bVar22;
    pIVar17->NavInputSource = bVar50 ^ ImGuiInputSource_Gamepad;
  }
  IVar60.x = (pIVar17->IO).DeltaTime + pIVar17->NavWindowingTimer;
  pIVar17->NavWindowingTimer = IVar60.x;
  pIVar33 = pIVar17->NavWindowingTarget;
  if (pIVar33 == (ImGuiWindow *)0x0) goto LAB_001bef4c;
  IVar26 = pIVar17->NavInputSource;
  if (IVar26 == ImGuiInputSource_Gamepad) {
    fVar64 = (IVar60.x + -0.2) / 0.05;
    IVar60.x = 1.0;
    if (fVar64 <= 1.0) {
      IVar60.x = fVar64;
    }
    IVar60.x = (float)(~-(uint)(fVar64 < 0.0) & (uint)IVar60.x);
    uVar55 = -(uint)(IVar60.x <= pIVar17->NavWindowingHighlightAlpha);
    pIVar17->NavWindowingHighlightAlpha =
         (float)(uVar55 & (uint)pIVar17->NavWindowingHighlightAlpha | ~uVar55 & (uint)IVar60.x);
    bVar53 = IsKeyPressed(ImGuiKey_GamepadL1,true);
    bVar22 = IsKeyPressed(ImGuiKey_GamepadR1,true);
    if ((uint)bVar53 - (uint)bVar22 != 0) {
      NavUpdateWindowingHighlightWindow((uint)bVar53 - (uint)bVar22);
      pIVar17->NavWindowingHighlightAlpha = 1.0;
    }
    bVar53 = IsKeyDown(ImGuiKey_GamepadFaceLeft);
    if (bVar53) {
      pIVar33 = pIVar17->NavWindowingTarget;
      if (pIVar33 == (ImGuiWindow *)0x0) goto LAB_001bef4c;
      IVar26 = pIVar17->NavInputSource;
      goto LAB_001beece;
    }
    pbVar30 = &pIVar17->NavWindowingToggleLayer;
    *pbVar30 = (bool)(*pbVar30 &
                     (pIVar17->NavWindowingHighlightAlpha <= 1.0 &&
                     pIVar17->NavWindowingHighlightAlpha != 1.0));
    if (*pbVar30 == false) {
      pIVar33 = pIVar17->NavWindowingTarget;
      bVar53 = false;
    }
    else {
      bVar53 = pIVar17->NavWindow != (ImGuiWindow *)0x0;
      pIVar33 = (ImGuiWindow *)0x0;
    }
    pIVar17->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  else {
LAB_001beece:
    if (IVar26 == ImGuiInputSource_Keyboard) {
      fVar64 = (pIVar17->NavWindowingTimer + -0.2) / 0.05;
      IVar60.x = 1.0;
      if (fVar64 <= 1.0) {
        IVar60.x = fVar64;
      }
      IVar60.x = (float)(~-(uint)(fVar64 < 0.0) & (uint)IVar60.x);
      uVar55 = -(uint)(IVar60.x <= pIVar17->NavWindowingHighlightAlpha);
      pIVar17->NavWindowingHighlightAlpha =
           (float)(uVar55 & (uint)pIVar17->NavWindowingHighlightAlpha | ~uVar55 & (uint)IVar60.x);
      if ((bVar21 | bVar20) == 1) {
        NavUpdateWindowingHighlightWindow(-(uint)bVar20 | 1);
        goto LAB_001bef4c;
      }
      uVar46 = pIVar17->ConfigNavWindowingKeyNext & 0xf000;
      uVar55 = pIVar17->ConfigNavWindowingKeyPrev;
      if (pIVar17->ConfigNavWindowingKeyPrev == 0) {
        uVar55 = 0xf000;
      }
      if (pIVar17->ConfigNavWindowingKeyNext == 0) {
        uVar46 = 0xf000;
      }
      if ((uVar46 & uVar55 & ~(pIVar17->IO).KeyMods) == 0) {
        pIVar33 = (ImGuiWindow *)0x0;
      }
    }
    else {
LAB_001bef4c:
      pIVar33 = (ImGuiWindow *)0x0;
    }
    bVar53 = false;
  }
  if ((((uint)local_88 & 1) != 0) && (bVar20 = IsKeyPressed(ImGuiKey_ModAlt,0xffffffff,0), bVar20))
  {
    pIVar17->NavWindowingToggleLayer = true;
    pIVar17->NavInputSource = ImGuiInputSource_Keyboard;
  }
  if ((pIVar17->NavWindowingToggleLayer == true) &&
     (pIVar17->NavInputSource == ImGuiInputSource_Keyboard)) {
    if (((0 < (pIVar17->IO).InputQueueCharacters.Size) ||
        ((((pIVar17->IO).KeyCtrl != false || ((pIVar17->IO).KeyShift != false)) ||
         ((pIVar17->IO).KeySuper != false)))) ||
       (bVar20 = TestKeyOwner(ImGuiKey_ModAlt,0xffffffff), !bVar20)) {
      pIVar17->NavWindowingToggleLayer = false;
    }
    bVar20 = IsKeyReleased(ImGuiKey_ModAlt);
    if (((bVar20) && (pIVar17->NavWindowingToggleLayer == true)) &&
       ((pIVar17->ActiveId == 0 || (pIVar17->ActiveIdAllowOverlap == true)))) {
      bVar53 = (bool)(((pIVar17->IO).MousePosPrev.y < -256000.0 ||
                      (pIVar17->IO).MousePosPrev.x < -256000.0) !=
                      (-256000.0 <= (pIVar17->IO).MousePos.x &&
                      -256000.0 <= (pIVar17->IO).MousePos.y) | bVar53);
    }
    bVar20 = IsKeyDown(ImGuiKey_ModAlt);
    if (!bVar20) {
      pIVar17->NavWindowingToggleLayer = false;
    }
  }
  if ((pIVar17->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     ((pIVar17->NavWindowingTarget->Flags & 4) == 0)) {
    IVar26 = pIVar17->NavInputSource;
    auVar70 = ZEXT816(0);
    if (IVar26 == ImGuiInputSource_Keyboard) {
      if ((pIVar17->IO).KeyShift == false) {
        auVar70._0_8_ =
             GetKeyVector2d(ImGuiKey_LeftArrow,ImGuiKey_RightArrow,ImGuiKey_UpArrow,
                            ImGuiKey_DownArrow);
        auVar70._8_8_ = extraout_XMM0_Qb;
        IVar26 = pIVar17->NavInputSource;
        goto LAB_001bf0b9;
      }
    }
    else {
LAB_001bf0b9:
      if (IVar26 == ImGuiInputSource_Gamepad) {
        auVar70._0_8_ =
             GetKeyVector2d(ImGuiKey_GamepadLStickLeft,ImGuiKey_GamepadLStickRight,
                            ImGuiKey_GamepadLStickUp,ImGuiKey_GamepadLStickDown);
        auVar70._8_8_ = extraout_XMM0_Qb_00;
        IVar26 = extraout_EAX;
      }
    }
    IVar74 = _local_98;
    IVar60.x = auVar70._4_4_;
    if (((auVar70._0_4_ != 0.0) || (IVar60.x != 0.0)) || (NAN(IVar60.x))) {
      fVar64 = (pIVar17->IO).DisplayFramebufferScale.x;
      fVar68 = (pIVar17->IO).DisplayFramebufferScale.y;
      if (fVar68 <= fVar64) {
        fVar64 = fVar68;
      }
      fVar64 = fVar64 * (pIVar17->IO).DeltaTime * 800.0;
      pIVar17->NavDisableMouseHover = true;
      IVar59.x = (pIVar17->NavWindowingAccumDeltaPos).x + auVar70._0_4_ * fVar64;
      IVar59.y = (pIVar17->NavWindowingAccumDeltaPos).y + IVar60.x * fVar64;
      pIVar17->NavWindowingAccumDeltaPos = IVar59;
      iVar56 = (int)IVar59.x;
      iVar63 = (int)IVar59.y;
      auVar69._0_4_ = -(uint)(iVar56 == 0);
      auVar69._4_4_ = -(uint)(iVar56 == 0);
      auVar69._8_4_ = -(uint)(iVar63 == 0);
      auVar69._12_4_ = -(uint)(iVar63 == 0);
      iVar35 = movmskpd(IVar26,auVar69);
      if (iVar35 != 3) {
        local_88 = (float)iVar56;
        fStack_84 = (float)iVar63;
        fStack_80 = (float)(int)(auVar70._8_4_ * fVar64 + 0.0);
        fStack_7c = (float)(int)(auVar70._12_4_ * fVar64 + 0.0);
        pIVar40 = pIVar17->NavWindowingTarget->RootWindow;
        IVar60 = pIVar40->Pos;
        local_98._4_4_ = IVar60.y + fStack_84;
        local_98._0_4_ = IVar60.x + local_88;
        IStack_90 = IVar74.Max;
        SetWindowPos(pIVar40,(ImVec2 *)local_98,1);
        IVar58.x = (pIVar17->NavWindowingAccumDeltaPos).x - local_88;
        IVar58.y = (pIVar17->NavWindowingAccumDeltaPos).y - fStack_84;
        pIVar17->NavWindowingAccumDeltaPos = IVar58;
      }
    }
  }
  if (pIVar33 != (ImGuiWindow *)0x0) {
    if ((pIVar17->NavWindow == (ImGuiWindow *)0x0) || (pIVar33 != pIVar17->NavWindow->RootWindow)) {
      ClearActiveID();
      pIVar18 = GImGui;
      pIVar18->NavMousePosDirty = true;
      pIVar18->NavDisableHighlight = false;
      pIVar18->NavDisableMouseHover = true;
      pIVar40 = pIVar33->NavLastChildNavWindow;
      if ((pIVar40 == (ImGuiWindow *)0x0) || (pIVar40->WasActive == false)) {
        pIVar40 = pIVar33;
      }
      ClosePopupsOverWindow(pIVar40,false);
      FocusWindow(pIVar40);
      if (pIVar40->NavLastIds[0] == 0) {
        NavInitWindow(pIVar40,false);
      }
      if ((pIVar40->DC).NavLayersActiveMaskNext == 2) {
        pIVar17->NavLayer = ImGuiNavLayer_Menu;
      }
    }
    pIVar17->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar53) && (pIVar17->NavWindow != (ImGuiWindow *)0x0)) {
    IVar27 = ImGuiNavLayer_Menu;
    ClearActiveID();
    pIVar33 = pIVar17->NavWindow;
    pIVar40 = pIVar33;
    do {
      window = pIVar40;
      if ((window->ParentWindow == (ImGuiWindow *)0x0) ||
         (((window->DC).NavLayersActiveMask & 2) != 0)) break;
      pIVar40 = window->ParentWindow;
    } while ((window->Flags & 0x15000000U) == 0x1000000);
    if (window != pIVar33) {
      FocusWindow(window);
      window->NavLastChildNavWindow = pIVar33;
      pIVar33 = pIVar17->NavWindow;
    }
    IVar6 = pIVar17->NavLayer;
    if (((pIVar33->DC).NavLayersActiveMask & 2) == 0) {
      IVar27 = ImGuiNavLayer_Main;
      if (IVar6 == ImGuiNavLayer_Main) goto LAB_001bf36d;
    }
    else if (IVar6 == ImGuiNavLayer_Main) {
      pIVar33->NavLastIds[1] = 0;
    }
    else {
      IVar27 = IVar6 ^ ImGuiNavLayer_Menu;
    }
    NavRestoreLayer(IVar27);
    pIVar17 = GImGui;
    pIVar17->NavMousePosDirty = true;
    pIVar17->NavDisableHighlight = false;
    pIVar17->NavDisableMouseHover = true;
  }
LAB_001bf36d:
  local_88 = (float)CONCAT31(local_88._1_3_,bVar45 | (byte)uVar54);
  if ((bVar45 == 0 && (uVar54 & 1) == 0) || (pIVar52->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar52->IO).NavActive = false;
LAB_001bf3bf:
    bVar53 = pIVar52->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar53 = (pIVar52->NavWindow->Flags & 0x40000U) == 0;
    (pIVar52->IO).NavActive = bVar53;
    if (((!bVar53) || (pIVar52->NavId == 0)) ||
       (bVar53 = true, pIVar52->NavDisableHighlight != false)) goto LAB_001bf3bf;
  }
  (pIVar52->IO).NavVisible = bVar53;
  pIVar17 = GImGui;
  uVar55 = (GImGui->IO).ConfigFlags;
  if ((uVar55 & 2) == 0) {
    bVar50 = 0;
  }
  else {
    bVar50 = (byte)(GImGui->IO).BackendFlags & 1;
  }
  if ((((uVar55 & 1) != 0) && (bVar53 = IsKeyPressed(ImGuiKey_Escape,0xffffffff,0), bVar53)) ||
     ((bVar50 != 0 && (bVar53 = IsKeyPressed(ImGuiKey_GamepadFaceRight,0xffffffff,0), bVar53)))) {
    if ((pIVar17->DebugLogFlags & 8) != 0) {
      DebugLog("[nav] NavUpdateCancelRequest()\n");
    }
    if (pIVar17->ActiveId == 0) {
      if (pIVar17->NavLayer == ImGuiNavLayer_Main) {
        pIVar33 = pIVar17->NavWindow;
        if (((pIVar33 == (ImGuiWindow *)0x0) || (pIVar33 == pIVar33->RootWindow)) ||
           (((pIVar33->Flags & 0x4000000) != 0 ||
            (pIVar40 = pIVar33->ParentWindow, pIVar40 == (ImGuiWindow *)0x0)))) {
          iVar35 = (pIVar17->OpenPopupStack).Size;
          if ((((long)iVar35 < 1) ||
              (pIVar40 = (pIVar17->OpenPopupStack).Data[(long)iVar35 + -1].Window,
              pIVar40 == (ImGuiWindow *)0x0)) || ((pIVar40->Flags & 0x8000000) != 0)) {
            if ((pIVar33 != (ImGuiWindow *)0x0) && ((pIVar33->Flags & 0x5000000U) != 0x1000000)) {
              pIVar33->NavLastIds[0] = 0;
            }
            pIVar17->NavId = 0;
          }
          else {
            ClosePopupToLevel(iVar35 + -1,true);
          }
        }
        else {
          _local_98 = ImGuiWindow::Rect(pIVar33);
          FocusWindow(pIVar40);
          IVar24 = pIVar33->ChildId;
          IVar74 = WindowRectAbsToRel(pIVar40,(ImRect *)local_98);
          pIVar17 = GImGui;
          GImGui->NavId = IVar24;
          pIVar17->NavLayer = ImGuiNavLayer_Main;
          pIVar17->NavFocusScopeId = 0;
          pIVar17->NavWindow->NavLastIds[0] = IVar24;
          pIVar17->NavWindow->NavRectRel[0] = IVar74;
          pIVar17->NavMousePosDirty = true;
          pIVar17->NavDisableHighlight = false;
          pIVar17->NavDisableMouseHover = true;
        }
      }
      else {
        NavRestoreLayer(ImGuiNavLayer_Main);
        pIVar17 = GImGui;
        pIVar17->NavMousePosDirty = true;
        pIVar17->NavDisableHighlight = false;
        pIVar17->NavDisableMouseHover = true;
      }
    }
    else {
      ClearActiveID();
    }
  }
  pIVar52->NavActivateFlags = 0;
  pIVar52->NavActivateId = 0;
  pIVar52->NavActivateDownId = 0;
  pIVar52->NavActivatePressedId = 0;
  pIVar52->NavActivateInputId = 0;
  bVar50 = bVar45;
  if (((pIVar52->NavId == 0) || (pIVar52->NavDisableHighlight != false)) ||
     (pIVar52->NavWindowingTarget != (ImGuiWindow *)0x0)) goto LAB_001bf5c6;
  if (pIVar52->NavWindow != (ImGuiWindow *)0x0) {
    if ((pIVar52->NavWindow->Flags & 0x40000) != 0) goto LAB_001bf5c6;
    if ((uVar54 & 1) == 0) {
      if (bVar45 != 0) goto LAB_001bffa7;
      IVar24 = pIVar52->ActiveId;
      bVar53 = false;
      bVar50 = 0;
      if (IVar24 == 0) goto LAB_001bf5c6;
LAB_001c0d88:
      IVar37 = pIVar52->NavId;
      bVar20 = false;
LAB_001c0f3a:
      if ((bVar53) && (IVar24 == IVar37)) {
        pIVar52->NavActivateDownId = IVar37;
      }
      bVar53 = (bVar20 & IVar24 == IVar37) == 0;
LAB_001c0fea:
      bVar50 = bVar45;
      if (!bVar53) goto LAB_001c1001;
    }
    else {
      bVar53 = IsKeyDown(ImGuiKey_Space);
      if (bVar53 || bVar45 != 1) {
        if (bVar53) {
LAB_001bffc8:
          bVar20 = IsKeyPressed(ImGuiKey_Space,false);
          if (bVar45 == 1 && !bVar20) goto LAB_001c0dfc;
          bVar53 = true;
        }
        else {
          bVar20 = false;
          bVar53 = false;
        }
LAB_001c0e1c:
        bVar21 = IsKeyDown(ImGuiKey_Enter);
        if (bVar45 == 1 && !bVar21) goto LAB_001c0e40;
        if (!bVar21) goto LAB_001c0ed3;
LAB_001c0e61:
        bVar21 = IsKeyPressed(ImGuiKey_Enter,false);
        if (bVar45 == 1 && !bVar21) {
LAB_001c0ec5:
          bVar21 = IsKeyPressed(ImGuiKey_GamepadFaceUp,false);
        }
      }
      else {
LAB_001bffa7:
        bVar53 = IsKeyDown(ImGuiKey_GamepadFaceDown);
        if (bVar53) {
          if ((uVar54 & 1) != 0) goto LAB_001bffc8;
          if (bVar45 == 0) {
            IVar24 = pIVar52->ActiveId;
            bVar53 = true;
            if (IVar24 == 0) {
              pIVar52->NavActivateDownId = pIVar52->NavId;
              bVar50 = 0;
              goto LAB_001bf5c6;
            }
            goto LAB_001c0d88;
          }
LAB_001c0dfc:
          bVar20 = IsKeyPressed(ImGuiKey_GamepadFaceDown,false);
          bVar53 = true;
        }
        else {
          bVar53 = false;
          bVar20 = false;
        }
        if ((uVar54 & 1) != 0) goto LAB_001c0e1c;
        if (bVar45 == 0) goto LAB_001c0ed3;
LAB_001c0e40:
        bVar21 = IsKeyDown(ImGuiKey_GamepadFaceUp);
        if (bVar21) {
          if ((uVar54 & 1) != 0) goto LAB_001c0e61;
          if (bVar45 != 0) goto LAB_001c0ec5;
        }
LAB_001c0ed3:
        bVar21 = false;
      }
      IVar24 = pIVar52->ActiveId;
      if (bVar20 == true && IVar24 == 0) {
        IVar37 = pIVar52->NavId;
        pIVar52->NavActivateId = IVar37;
        pIVar52->NavActivateFlags = 2;
        bVar22 = true;
        if (bVar21 == false) goto LAB_001c0fd5;
LAB_001c0f62:
        pIVar52->NavActivateInputId = IVar37;
        pIVar52->NavActivateFlags = 1;
        if (bVar53) {
          pIVar52->NavActivateDownId = IVar37;
          bVar53 = bVar20 == false;
          goto LAB_001c0fea;
        }
      }
      else {
        if (IVar24 != 0) {
          IVar37 = pIVar52->NavId;
          if ((bVar21 & IVar24 == pIVar52->NavId) != 0) {
            pIVar52->NavActivateInputId = IVar24;
            pIVar52->NavActivateFlags = 1;
            IVar37 = IVar24;
          }
          goto LAB_001c0f3a;
        }
        bVar22 = bVar20;
        if (bVar21 != false) {
          IVar37 = pIVar52->NavId;
          goto LAB_001c0f62;
        }
LAB_001c0fd5:
        bVar20 = bVar22;
        if (bVar53) {
          IVar37 = pIVar52->NavId;
          pIVar52->NavActivateDownId = IVar37;
          bVar53 = bVar20 == false;
          goto LAB_001c0fea;
        }
      }
      if (bVar20 != false) {
        IVar37 = pIVar52->NavId;
LAB_001c1001:
        pIVar52->NavActivatePressedId = IVar37;
        bVar50 = bVar45;
      }
    }
LAB_001bf5c6:
    bVar45 = bVar50;
    if ((pIVar52->NavWindow != (ImGuiWindow *)0x0) && ((pIVar52->NavWindow->Flags & 0x40000) != 0))
    {
      pIVar52->NavDisableHighlight = true;
    }
  }
  IVar24 = pIVar52->NavNextActivateId;
  if (IVar24 != 0) {
    if ((pIVar52->NavNextActivateFlags & 1U) == 0) {
      pIVar52->NavActivatePressedId = IVar24;
      pIVar52->NavActivateDownId = IVar24;
      pIVar52->NavActivateId = IVar24;
    }
    else {
      pIVar52->NavActivateInputId = IVar24;
    }
    pIVar52->NavActivateFlags = pIVar52->NavNextActivateFlags;
  }
  pIVar52->NavNextActivateId = 0;
  pIVar17 = GImGui;
  pIVar33 = GImGui->NavWindow;
  uVar54 = (GImGui->IO).ConfigFlags;
  if ((uVar54 & 2) == 0) {
    bVar50 = 0;
  }
  else {
    bVar50 = (byte)(GImGui->IO).BackendFlags & 1;
  }
  if ((pIVar33 != (ImGuiWindow *)0x0 & GImGui->NavMoveForwardToNextFrame) == 1) {
    if ((GImGui->DebugLogFlags & 8) != 0) {
      DebugLog("[nav] NavMoveRequestForward %d\n",(ulong)(uint)GImGui->NavMoveDir);
    }
LAB_001bf818:
    IVar60.x = 0.0;
    if (((((uVar54 & 1) != 0) && (pIVar17->NavMoveDir == -1)) &&
        (pIVar40 = GImGui->NavWindow, (pIVar40->Flags & 0x40000) == 0)) &&
       (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)) {
      local_68 = (int)GImGui;
      iStack_64 = (int)((ulong)GImGui >> 0x20);
      bVar53 = IsKeyDown(ImGuiKey_PageUp,0xffffffff);
      bVar20 = IsKeyDown(ImGuiKey_PageDown,0xffffffff);
      bVar21 = IsKeyPressed(ImGuiKey_Home,0xffffffff,1);
      bVar22 = IsKeyPressed(ImGuiKey_End,0xffffffff,1);
      local_58 = (float)CONCAT31(local_58._1_3_,bVar21);
      if (bVar21 != bVar22 || bVar20 != bVar53) {
        local_78 = (float)CONCAT31(local_78._1_3_,bVar22);
        lVar43 = CONCAT44(iStack_64,local_68);
        if (*(int *)(lVar43 + 0x48a4) != 0) {
          NavRestoreLayer(ImGuiNavLayer_Main);
        }
        if (((pIVar40->DC).NavLayersActiveMask != 0) || ((pIVar40->DC).NavHasScroll != true)) {
          uVar54 = *(uint *)(lVar43 + 0x48a4);
          IVar60.x = (pIVar40->InnerRect).Max.y;
          fVar64 = (pIVar40->InnerRect).Min.y;
          fVar68 = ImGuiWindow::CalcFontSize(pIVar40);
          IVar60.x = (pIVar40->NavRectRel[uVar54].Max.y - pIVar40->NavRectRel[uVar54].Min.y) +
                     ((IVar60.x - fVar64) - fVar68);
          IVar60.x = (float)(~-(uint)(IVar60.x <= 0.0) & (uint)IVar60.x);
          local_38 = pIVar40;
          bVar53 = IsKeyPressed(ImGuiKey_PageUp,true);
          if (bVar53) {
            IVar60.x = -IVar60.x;
            uVar36 = 2;
            uVar28 = 3;
          }
          else {
            bVar53 = IsKeyPressed(ImGuiKey_PageDown,true);
            if (!bVar53) {
              pIVar34 = local_38->NavRectRel + uVar54;
              if (local_58._0_1_ != '\0') {
                local_38->NavRectRel[uVar54].Max.y = 0.0;
                local_38->NavRectRel[uVar54].Min.y = 0.0;
                IVar60.x = (pIVar34->Min).x;
                pIVar2 = &local_38->NavRectRel[uVar54].Max;
                if (pIVar2->x <= IVar60.x && IVar60.x != pIVar2->x) {
                  local_38->NavRectRel[uVar54].Max.x = 0.0;
                  (pIVar34->Min).x = 0.0;
                }
                *(undefined4 *)(lVar43 + 0x48d4) = 3;
                *(undefined4 *)(lVar43 + 0x48c8) = 0x50;
                goto LAB_001bf95d;
              }
              IVar60.x = 0.0;
              if (local_78._0_1_ != '\0') {
                fVar64 = (local_38->ContentSize).y;
                local_38->NavRectRel[uVar54].Max.y = fVar64;
                local_38->NavRectRel[uVar54].Min.y = fVar64;
                fVar64 = (pIVar34->Min).x;
                pIVar2 = &local_38->NavRectRel[uVar54].Max;
                if (pIVar2->x <= fVar64 && fVar64 != pIVar2->x) {
                  local_38->NavRectRel[uVar54].Max.x = 0.0;
                  (pIVar34->Min).x = 0.0;
                }
                *(undefined4 *)(lVar43 + 0x48d4) = 2;
                *(undefined4 *)(lVar43 + 0x48c8) = 0x50;
              }
              goto LAB_001bf965;
            }
            uVar28 = 2;
            uVar36 = 3;
          }
          *(undefined4 *)(lVar43 + 0x48d4) = uVar28;
          *(undefined4 *)(lVar43 + 0x48dc) = uVar36;
          *(undefined4 *)(lVar43 + 0x48c8) = 0x30;
          if ((IVar60.x != 0.0) || (NAN(IVar60.x))) {
            IVar59 = (pIVar33->InnerRect).Max;
            (pIVar17->NavScoringNoClipRect).Min = (pIVar33->InnerRect).Min;
            (pIVar17->NavScoringNoClipRect).Max = IVar59;
            (pIVar17->NavScoringNoClipRect).Min.y = (pIVar17->NavScoringNoClipRect).Min.y + IVar60.x
            ;
            (pIVar17->NavScoringNoClipRect).Max.y = (pIVar17->NavScoringNoClipRect).Max.y + IVar60.x
            ;
          }
          goto LAB_001bf965;
        }
        bVar53 = IsKeyPressed(ImGuiKey_PageUp,0xffffffff,1);
        if (bVar53) {
          (pIVar40->ScrollTarget).y =
               (pIVar40->Scroll).y - ((pIVar40->InnerRect).Max.y - (pIVar40->InnerRect).Min.y);
          (pIVar40->ScrollTargetCenterRatio).y = 0.0;
          (pIVar40->ScrollTargetEdgeSnapDist).y = 0.0;
        }
        else {
          bVar53 = IsKeyPressed(ImGuiKey_PageDown,0xffffffff,1);
          if (!bVar53) {
            IVar60.x = 0.0;
            if (local_58._0_1_ == '\0') {
              if (local_78._0_1_ == '\0') goto LAB_001bf965;
              (pIVar40->ScrollTarget).y = (pIVar40->ScrollMax).y;
            }
            else {
              (pIVar40->ScrollTarget).y = 0.0;
            }
            (pIVar40->ScrollTargetCenterRatio).y = 0.0;
            (pIVar40->ScrollTargetEdgeSnapDist).y = 0.0;
            goto LAB_001bf965;
          }
          (pIVar40->ScrollTarget).y =
               ((pIVar40->InnerRect).Max.y - (pIVar40->InnerRect).Min.y) + (pIVar40->Scroll).y;
          (pIVar40->ScrollTargetCenterRatio).y = 0.0;
          (pIVar40->ScrollTargetEdgeSnapDist).y = 0.0;
        }
      }
LAB_001bf93b:
      IVar60.x = 0.0;
    }
  }
  else {
    GImGui->NavMoveDir = -1;
    pIVar17->NavMoveFlags = 0;
    pIVar17->NavMoveScrollFlags = 0;
    if (pIVar33 != (ImGuiWindow *)0x0) {
      if ((pIVar17->NavWindowingTarget == (ImGuiWindow *)0x0) && ((pIVar33->Flags & 0x40000) == 0))
      {
        if (((pIVar17->ActiveIdUsingNavDirMask & 1) == 0) &&
           (((bVar50 != 0 && (bVar53 = IsKeyPressed(ImGuiKey_GamepadDpadLeft,0xffffffff,5), bVar53))
            || (((uVar54 & 1) != 0 &&
                (bVar53 = IsKeyPressed(ImGuiKey_LeftArrow,0xffffffff,5), bVar53)))))) {
          pIVar17->NavMoveDir = 0;
        }
        if (((GImGui->ActiveIdUsingNavDirMask & 2) == 0) &&
           (((bVar50 != 0 && (bVar53 = IsKeyPressed(ImGuiKey_GamepadDpadRight,0xffffffff,5), bVar53)
             ) || (((uVar54 & 1) != 0 &&
                   (bVar53 = IsKeyPressed(ImGuiKey_RightArrow,0xffffffff,5), bVar53)))))) {
          pIVar17->NavMoveDir = 1;
        }
        if (((GImGui->ActiveIdUsingNavDirMask & 4) == 0) &&
           (((bVar50 != 0 && (bVar53 = IsKeyPressed(ImGuiKey_GamepadDpadUp,0xffffffff,5), bVar53))
            || (((uVar54 & 1) != 0 && (bVar53 = IsKeyPressed(ImGuiKey_UpArrow,0xffffffff,5), bVar53)
                ))))) {
          pIVar17->NavMoveDir = 2;
        }
        if (((GImGui->ActiveIdUsingNavDirMask & 8) == 0) &&
           (((bVar50 != 0 && (bVar53 = IsKeyPressed(ImGuiKey_GamepadDpadDown,0xffffffff,5), bVar53))
            || (((uVar54 & 1) != 0 &&
                (bVar53 = IsKeyPressed(ImGuiKey_DownArrow,0xffffffff,5), bVar53)))))) {
          pIVar17->NavMoveDir = 3;
        }
      }
      pIVar17->NavMoveClipDir = pIVar17->NavMoveDir;
      (pIVar17->NavScoringNoClipRect).Min.x = 3.4028235e+38;
      (pIVar17->NavScoringNoClipRect).Min.y = 3.4028235e+38;
      (pIVar17->NavScoringNoClipRect).Max.x = -3.4028235e+38;
      (pIVar17->NavScoringNoClipRect).Max.y = -3.4028235e+38;
      if (pIVar33 != (ImGuiWindow *)0x0) goto LAB_001bf818;
      goto LAB_001bf93b;
    }
    pIVar17->NavMoveClipDir = pIVar17->NavMoveDir;
    (pIVar17->NavScoringNoClipRect).Min.x = 3.4028235e+38;
    (pIVar17->NavScoringNoClipRect).Min.y = 3.4028235e+38;
    (pIVar17->NavScoringNoClipRect).Max.x = -3.4028235e+38;
    (pIVar17->NavScoringNoClipRect).Max.y = -3.4028235e+38;
LAB_001bf95d:
    IVar60.x = 0.0;
  }
LAB_001bf965:
  pIVar17->NavMoveForwardToNextFrame = false;
  if (pIVar17->NavMoveDir != -1) {
    NavMoveRequestSubmit
              (pIVar17->NavMoveDir,pIVar17->NavMoveClipDir,pIVar17->NavMoveFlags,
               pIVar17->NavMoveScrollFlags);
  }
  bVar50 = pIVar17->NavMoveSubmitted;
  if (((bool)bVar50 == true) && (pIVar17->NavId == 0)) {
    if ((pIVar17->DebugLogFlags & 8) != 0) {
      if (pIVar33 == (ImGuiWindow *)0x0) {
        pcVar47 = "<NULL>";
      }
      else {
        pcVar47 = pIVar33->Name;
      }
      DebugLog("[nav] NavInitRequest: from move, window \"%s\", layer=%d\n",pcVar47,
               (ulong)pIVar17->NavLayer);
      bVar50 = pIVar17->NavMoveSubmitted;
    }
    pIVar17->NavInitRequest = true;
    pIVar17->NavInitRequestFromMove = true;
    pIVar17->NavInitResultId = 0;
    pIVar17->NavDisableHighlight = false;
  }
  if ((((bVar50 & 1) == 0) || (pIVar17->NavInputSource != ImGuiInputSource_Gamepad)) ||
     (pIVar17->NavLayer != ImGuiNavLayer_Main || pIVar33 == (ImGuiWindow *)0x0)) {
    _local_98 = (ImRect)ZEXT816(0);
    if (pIVar33 != (ImGuiWindow *)0x0) goto LAB_001bfc03;
  }
  else {
    local_68 = -(uint)((pIVar17->NavMoveFlags & 5U) == 0);
    iStack_64 = -(uint)((pIVar17->NavMoveFlags & 10U) == 0);
    iStack_60 = -1;
    iStack_5c = -1;
    local_48.Min.y = (pIVar33->InnerRect).Min.y + -1.0;
    local_48.Min.x = (pIVar33->InnerRect).Min.x + -1.0;
    local_48.Max.y = (pIVar33->InnerRect).Max.y + 1.0;
    local_48.Max.x = (pIVar33->InnerRect).Max.x + 1.0;
    _local_98 = WindowRectAbsToRel(pIVar33,&local_48);
    auVar14._4_4_ = iStack_64;
    auVar14._0_4_ = local_68;
    auVar14._8_4_ = iStack_60;
    auVar14._12_4_ = iStack_5c;
    auVar62._4_4_ = iStack_64;
    auVar62._0_4_ = iStack_64;
    auVar62._8_4_ = iStack_64;
    auVar62._12_4_ = iStack_64;
    if ((((auVar62 | auVar14) & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
       (bVar53 = ImRect::Contains((ImRect *)local_98,pIVar33->NavRectRel + pIVar17->NavLayer),
       !bVar53)) {
      iStack_60 = local_68;
      iStack_5c = iStack_64;
      local_78 = local_98._0_4_;
      fStack_74 = local_98._4_4_;
      fStack_70 = local_98._8_4_;
      fStack_6c = local_98._12_4_;
      local_58 = ImGuiWindow::CalcFontSize(pIVar33);
      local_78 = fStack_70 - local_78;
      fStack_74 = IStack_90.y - (float)local_98._4_4_;
      fStack_70 = fStack_6c - fStack_70;
      fStack_6c = 0.0 - fStack_6c;
      fStack_54 = extraout_XMM0_Db;
      fVar64 = ImGuiWindow::CalcFontSize(pIVar33);
      auVar66._0_4_ = local_58 * 0.5;
      auVar66._4_4_ = fVar64 * 0.5;
      auVar66._8_4_ = fStack_54 * 0.0;
      auVar66._12_4_ = extraout_XMM0_Db_00 * 0.0;
      auVar13._4_4_ = fStack_74;
      auVar13._0_4_ = local_78;
      auVar13._8_4_ = fStack_70;
      auVar13._12_4_ = fStack_6c;
      auVar70 = minps(auVar13,auVar66);
      fVar64 = local_98._0_4_;
      fVar68 = local_98._4_4_;
      auVar12._4_4_ = local_98._8_8_.x;
      auVar12._8_4_ = local_98._8_8_.y;
      auVar12._0_4_ = fVar68 - extraout_XMM0_Db_00;
      auVar67._0_8_ = auVar12._0_8_ << 0x20;
      auVar67._8_4_ = local_98._8_4_ - auVar70._0_4_;
      auVar67._12_4_ = local_98._12_4_ - auVar70._4_4_;
      IStack_90 = (ImVec2)(~CONCAT44(iStack_5c,iStack_60) & 0x7f7fffff7f7fffff |
                          auVar67._8_8_ & CONCAT44(iStack_5c,iStack_60));
      local_98 = (undefined1  [8])
                 (~CONCAT44(iStack_64,local_68) & 0xff7fffffff7fffff |
                 CONCAT44(auVar70._4_4_ + fVar68,auVar70._0_4_ + fVar64) &
                 CONCAT44(iStack_64,local_68));
      ImRect::ClipWithFull(pIVar33->NavRectRel + pIVar17->NavLayer,(ImRect *)local_98);
      pIVar17->NavId = 0;
    }
LAB_001bfc03:
    IVar27 = pIVar17->NavLayer;
    fVar64 = pIVar33->NavRectRel[IVar27].Min.x;
    pIVar2 = &pIVar33->NavRectRel[IVar27].Max;
    if ((pIVar2->x <= fVar64 && fVar64 != pIVar2->x) ||
       (fVar64 = pIVar33->NavRectRel[IVar27].Min.y, pfVar3 = &pIVar33->NavRectRel[IVar27].Max.y,
       *pfVar3 <= fVar64 && fVar64 != *pfVar3)) {
      local_48.Min.x = 0.0;
      local_48.Min.y = 0.0;
      local_48.Max.x = 0.0;
      local_48.Max.y = 0.0;
    }
    else {
      local_48.Min = pIVar33->NavRectRel[IVar27].Min;
      local_48.Max = pIVar33->NavRectRel[IVar27].Max;
    }
    IVar74 = WindowRectRelToAbs(pIVar33,&local_48);
    fVar64 = IVar74.Min.x + 1.0;
    auVar15._4_4_ = IStack_90.x;
    auVar15._8_4_ = IStack_90.y;
    auVar15._0_4_ = IVar74.Min.y + IVar60.x;
    _local_98 = auVar15 << 0x20;
    if (IVar74.Max.x <= fVar64) {
      fVar64 = IVar74.Max.x;
    }
    IVar60.x = IVar74.Max.y + IVar60.x;
    IStack_90.y = IVar60.x;
    local_98._0_4_ = fVar64;
    IStack_90.x = fVar64;
  }
  IVar74 = _local_98;
  (pIVar17->NavScoringRect).Min.x = (float)local_98._0_4_;
  (pIVar17->NavScoringRect).Min.y = (float)local_98._4_4_;
  (pIVar17->NavScoringRect).Max = IStack_90;
  _local_98 = IVar74;
  ImRect::Add(&pIVar17->NavScoringNoClipRect,(ImRect *)local_98);
  pIVar17 = GImGui;
  if ((((pIVar52->NavMoveDir == -1) && (pIVar33 = GImGui->NavWindow, pIVar33 != (ImGuiWindow *)0x0))
      && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)) && ((pIVar33->Flags & 0x40000) == 0)) {
    uVar54 = 0xffffffff;
    bVar53 = IsKeyPressed(ImGuiKey_NamedKey_BEGIN,0xffffffff,1);
    if (((bVar53) && ((pIVar17->IO).KeyCtrl == false)) && ((pIVar17->IO).KeyAlt == false)) {
      if ((pIVar17->IO).KeyShift == false) {
        uVar54 = (uint)(pIVar17->ActiveId != 0);
      }
      pIVar17->NavTabbingDir = uVar54;
      scroll_flags = 3;
      if (pIVar33->Appearing != false) {
        scroll_flags = 0x21;
      }
      NavMoveRequestSubmit(-1,uVar54 >> 0x1f ^ 3,0x400,scroll_flags);
      pIVar17->NavTabbingCounter = -1;
    }
  }
  bVar53 = true;
  if (GImGui->NavMoveScoringItems == false) {
    bVar53 = GImGui->NavInitRequest;
  }
  GImGui->NavAnyRequest = bVar53;
  pIVar52->NavIdIsAlive = false;
  pIVar33 = pIVar52->NavWindow;
  if (((pIVar33 != (ImGuiWindow *)0x0) && ((pIVar33->Flags & 0x40000) == 0)) &&
     (pIVar52->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    IVar60.x = ImGuiWindow::CalcFontSize(pIVar33);
    IVar60.x = (float)(int)(IVar60.x * 100.0 * (pIVar52->IO).DeltaTime + 0.5);
    if (((pIVar33->DC).NavLayersActiveMask == 0) &&
       (uVar54 = pIVar52->NavMoveDir, (uVar54 != 0xffffffff & (pIVar33->DC).NavHasScroll) == 1)) {
      if (uVar54 < 2) {
        (pIVar33->ScrollTarget).x =
             (float)(int)(*(float *)(&DAT_00224d18 + (ulong)(uVar54 == 0) * 4) * IVar60.x +
                         (pIVar33->Scroll).x);
        (pIVar33->ScrollTargetCenterRatio).x = 0.0;
        (pIVar33->ScrollTargetEdgeSnapDist).x = 0.0;
      }
      if ((uVar54 & 0xfffffffe) == 2) {
        (pIVar33->ScrollTarget).y =
             (float)(int)(*(float *)(&DAT_00224d18 + (ulong)(uVar54 == 2) * 4) * IVar60.x +
                         (pIVar33->Scroll).y);
        (pIVar33->ScrollTargetCenterRatio).y = 0.0;
        (pIVar33->ScrollTargetEdgeSnapDist).y = 0.0;
      }
    }
    if (bVar45 != 0) {
      IVar59 = GetKeyVector2d(ImGuiKey_GamepadLStickLeft,ImGuiKey_GamepadLStickRight,
                              ImGuiKey_GamepadLStickUp,ImGuiKey_GamepadLStickDown);
      bVar53 = IsKeyDown(ImGuiKey_GamepadL1);
      if (bVar53) {
        fVar64 = 0.1;
      }
      else {
        bVar53 = IsKeyDown(ImGuiKey_GamepadR1);
        if (bVar53) {
          fVar64 = 10.0;
        }
        else {
          fVar64 = 1.0;
        }
      }
      local_b8 = IVar59.x;
      fStack_b4 = IVar59.y;
      if (((local_b8 != 0.0) || (NAN(local_b8))) && (pIVar33->ScrollbarX == true)) {
        (pIVar33->ScrollTarget).x = (float)(int)(local_b8 * IVar60.x * fVar64 + (pIVar33->Scroll).x)
        ;
        (pIVar33->ScrollTargetCenterRatio).x = 0.0;
        (pIVar33->ScrollTargetEdgeSnapDist).x = 0.0;
      }
      if ((fStack_b4 != 0.0) || (NAN(fStack_b4))) {
        (pIVar33->ScrollTarget).y =
             (float)(int)(fStack_b4 * IVar60.x * fVar64 + (pIVar33->Scroll).y);
        (pIVar33->ScrollTargetCenterRatio).y = 0.0;
        (pIVar33->ScrollTargetEdgeSnapDist).y = 0.0;
      }
    }
  }
  if (((uint)local_88 & 1) == 0) {
    pIVar52->NavDisableHighlight = true;
    pIVar52->NavDisableMouseHover = false;
  }
  else if (((bVar41) && (((pIVar52->IO).ConfigFlags & 4) != 0)) &&
          (((pIVar52->IO).BackendFlags & 4) != 0)) {
    IVar60 = NavCalcPreferredRefPos();
    (pIVar52->IO).MousePosPrev = IVar60;
    (pIVar52->IO).MousePos = IVar60;
    (pIVar52->IO).WantSetMousePos = true;
  }
  pIVar52->NavScoringDebugCount = 0;
  pIVar52 = GImGui;
  IVar60.x = (GImGui->IO).MousePos.x;
  fVar64 = (GImGui->IO).MousePos.y;
  if ((-256000.0 <= IVar60.x) && (-256000.0 <= fVar64)) {
    IVar60.x = ImFloorSigned(IVar60.x);
    fVar64 = ImFloorSigned(fVar64);
    IVar60.y = fVar64;
    pIVar52->MouseLastValidPos = IVar60;
    (pIVar52->IO).MousePos = IVar60;
  }
  if ((((IVar60.x < -256000.0) || (fVar64 < -256000.0)) ||
      (fVar68 = (pIVar52->IO).MousePosPrev.x, fVar68 < -256000.0)) ||
     (fVar57 = (pIVar52->IO).MousePosPrev.y, fVar57 < -256000.0)) {
    (pIVar52->IO).MouseDelta.x = 0.0;
    (pIVar52->IO).MouseDelta.y = 0.0;
  }
  else {
    IVar60.x = IVar60.x - fVar68;
    fVar57 = fVar64 - fVar57;
    IVar65.y = fVar57;
    IVar65.x = IVar60.x;
    (pIVar52->IO).MouseDelta = IVar65;
    if (((IVar60.x != 0.0) || (fVar57 != 0.0)) || (NAN(fVar57))) {
      pIVar52->NavDisableMouseHover = false;
    }
  }
  IVar60 = (pIVar52->IO).MousePos;
  (pIVar52->IO).MousePosPrev = IVar60;
  lVar38 = 0x3742;
  lVar31 = 0x3756;
  lVar49 = 0;
  for (lVar43 = 0x3738; lVar43 != 0x373d; lVar43 = lVar43 + 1) {
    if (*(char *)((long)pIVar52 + lVar31 + -0x2952) == '\x01') {
      fVar68 = *(float *)((long)pIVar52 + lVar43 * 4 + -0xa578);
      fVar73 = 0.0;
      *(bool *)((long)pIVar52 + lVar31 + -0x1e) = fVar68 < 0.0;
      *(undefined2 *)((long)pIVar52 + lVar43 * 2 + -0x372e) = 0;
      (&pIVar52->Initialized)[lVar31] = false;
      fVar57 = *(float *)((long)pIVar52 + lVar43 * 4 + -0xa578);
      *(float *)((long)pIVar52 + lVar43 * 4 + -0xa564) = fVar57;
      if (0.0 <= fVar57) {
        fVar73 = fVar57 + (pIVar52->IO).DeltaTime;
      }
      pbVar30 = &pIVar52->Initialized + lVar43;
      pbVar44 = &pIVar52->Initialized + lVar38;
      *(float *)((long)pIVar52 + lVar43 * 4 + -0xa578) = fVar73;
      if (0.0 <= fVar68) {
        fVar68 = 0.0;
        if (-256000.0 <= fVar64 && -256000.0 <= IVar60.x) {
          fVar68 = IVar60.x - *(float *)((long)pIVar52 + lVar43 * 8 + -0x182d8);
          fVar57 = fVar64 - *(float *)((long)pIVar52 + lVar43 * 8 + -0x182d4);
          fVar68 = fVar68 * fVar68 + fVar57 * fVar57;
        }
        fVar57 = *(float *)((long)pIVar52 + lVar43 * 4 + -0xa550);
        uVar54 = -(uint)(fVar68 <= fVar57);
        *(uint *)((long)pIVar52 + lVar43 * 4 + -0xa550) =
             ~uVar54 & (uint)fVar68 | (uint)fVar57 & uVar54;
      }
      else {
        if ((pIVar52->IO).MouseDoubleClickTime <=
            (float)(pIVar52->Time - *(double *)((long)pIVar52 + lVar43 * 8 + -0x182b0))) {
LAB_001c037d:
          *(undefined2 *)((long)pIVar52 + lVar43 * 2 + -0x3724) = 1;
        }
        else {
          fVar68 = 0.0;
          fVar57 = 0.0;
          if (-256000.0 <= fVar64 && -256000.0 <= IVar60.x) {
            uVar5 = *(undefined8 *)((long)pIVar52 + lVar43 * 8 + -0x182d8);
            fVar68 = IVar60.x - (float)uVar5;
            fVar57 = fVar64 - (float)((ulong)uVar5 >> 0x20);
          }
          fVar73 = (pIVar52->IO).MouseDoubleClickMaxDist;
          if (fVar73 * fVar73 <= fVar68 * fVar68 + fVar57 * fVar57) goto LAB_001c037d;
          psVar4 = (short *)((long)pIVar52 + lVar43 * 2 + -0x3724);
          *psVar4 = *psVar4 + 1;
        }
        *(double *)((long)pIVar52 + lVar43 * 8 + -0x182b0) = pIVar52->Time;
        *(ImVec2 *)((long)pIVar52 + lVar43 * 8 + -0x182d8) = IVar60;
        *(undefined2 *)((long)pIVar52 + lVar43 * 2 + -0x372e) =
             *(undefined2 *)((long)pIVar52 + lVar43 * 2 + -0x3724);
        *(undefined4 *)((long)pIVar52 + lVar43 * 4 + -0xa550) = 0;
      }
    }
    else {
      *(undefined1 *)((long)pIVar52 + lVar31 + -0x1e) = 0;
      *(undefined2 *)((long)pIVar52 + lVar43 * 2 + -0x372e) = 0;
      pbVar30 = (pIVar52->IO).MouseClicked + lVar49;
      (&pIVar52->Initialized)[lVar31] = 0.0 <= *(float *)((long)pIVar52 + lVar43 * 4 + -0xa578);
      pbVar44 = (bool *)((pIVar52->IO).MouseClickedCount + lVar49);
      *(undefined4 *)((long)pIVar52 + lVar43 * 4 + -0xa564) =
           *(undefined4 *)((long)pIVar52 + lVar43 * 4 + -0xa578);
      *(undefined4 *)((long)pIVar52 + lVar43 * 4 + -0xa578) = 0xbf800000;
    }
    *(bool *)((long)pIVar52 + lVar31 + -0x19) = *(short *)pbVar44 == 2;
    if (*pbVar30 == true) {
      pIVar52->NavDisableMouseHover = false;
    }
    lVar49 = lVar49 + 1;
    lVar38 = lVar38 + 2;
    lVar31 = lVar31 + 1;
  }
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar33 = GetTopMostPopupModal();
  if ((pIVar33 != (ImGuiWindow *)0x0) ||
     ((ctx->NavWindowingTarget != (ImGuiWindow *)0x0 && (0.0 < ctx->NavWindowingHighlightAlpha)))) {
    IVar60.x = (ctx->IO).DeltaTime * 6.0 + ctx->DimBgRatio;
    if (1.0 <= IVar60.x) {
      IVar60.x = 1.0;
    }
    ctx->DimBgRatio = IVar60.x;
  }
  else {
    IVar60.x = (ctx->IO).DeltaTime * -10.0 + ctx->DimBgRatio;
    ctx->DimBgRatio = (float)(-(uint)(0.0 <= IVar60.x) & (uint)IVar60.x);
  }
  ctx->MouseCursor = 0;
  ctx->WantTextInputNextFrame = -1;
  ctx->WantCaptureMouseNextFrame = -1;
  ctx->WantCaptureKeyboardNextFrame = -1;
  uVar19 = *(undefined3 *)&(ctx->PlatformImeData).field_0x1;
  IVar60.x = (ctx->PlatformImeData).InputPos.x;
  uVar5 = *(undefined8 *)&(ctx->PlatformImeData).InputPos.y;
  (ctx->PlatformImeDataPrev).WantVisible = (ctx->PlatformImeData).WantVisible;
  *(undefined3 *)&(ctx->PlatformImeDataPrev).field_0x1 = uVar19;
  (ctx->PlatformImeDataPrev).InputPos.x = IVar60.x;
  *(undefined8 *)&(ctx->PlatformImeDataPrev).InputPos.y = uVar5;
  (ctx->PlatformImeData).WantVisible = false;
  pIVar52 = GImGui;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    fVar64 = GImGui->WheelingWindowReleaseTimer - (GImGui->IO).DeltaTime;
    GImGui->WheelingWindowReleaseTimer = fVar64;
    IVar60.x = (pIVar52->IO).MousePos.x;
    if (((IVar60.x < -256000.0) || (fVar68 = (pIVar52->IO).MousePos.y, fVar68 < -256000.0)) ||
       (IVar60.x = IVar60.x - (pIVar52->WheelingWindowRefMousePos).x,
       fVar68 = fVar68 - (pIVar52->WheelingWindowRefMousePos).y,
       fVar57 = (pIVar52->IO).MouseDragThreshold,
       IVar60.x * IVar60.x + fVar68 * fVar68 <= fVar57 * fVar57)) {
      if (0.0 < fVar64) goto LAB_001c0544;
    }
    else {
      pIVar52->WheelingWindowReleaseTimer = 0.0;
    }
    LockWheelingWindow((ImGuiWindow *)0x0,0.0);
  }
LAB_001c0544:
  bVar41 = TestKeyOwner(ImGuiKey_MouseWheelX,0xffffffff);
  IVar60.x = 0.0;
  if (bVar41) {
    IVar60.x = (pIVar52->IO).MouseWheelH;
  }
  bVar41 = TestKeyOwner(ImGuiKey_MouseWheelY,0xffffffff);
  fVar64 = 0.0;
  if (bVar41) {
    fVar64 = (pIVar52->IO).MouseWheel;
  }
  if (((((IVar60.x == 0.0) && (fVar64 == 0.0)) && (!NAN(fVar64))) ||
      ((pIVar33 = pIVar52->WheelingWindow, pIVar33 == (ImGuiWindow *)0x0 &&
       (pIVar33 = pIVar52->HoveredWindow, pIVar33 == (ImGuiWindow *)0x0)))) ||
     (pIVar33->Collapsed != false)) goto LAB_001c05bf;
  bVar41 = (pIVar52->IO).KeyCtrl;
  fVar68 = IVar60.x;
  if ((fVar64 != 0.0) || (NAN(fVar64))) {
    if ((bVar41 & 1U) != 0) {
      if ((pIVar52->IO).FontAllowUserScaling == true) {
        LockWheelingWindow(pIVar33,fVar64);
        IVar74 = _local_98;
        IVar60.x = pIVar33->FontWindowScale;
        fVar68 = (pIVar52->IO).MouseWheel * 0.1 + IVar60.x;
        fVar64 = 2.5;
        if (fVar68 <= 2.5) {
          fVar64 = fVar68;
        }
        fVar64 = (float)(-(uint)(fVar68 < 0.5) & 0x3f000000 | ~-(uint)(fVar68 < 0.5) & (uint)fVar64)
        ;
        pIVar33->FontWindowScale = fVar64;
        if (pIVar33 == pIVar33->RootWindow) {
          fVar64 = fVar64 / IVar60.x;
          IVar59 = pIVar33->Size;
          auVar71._8_8_ = 0;
          auVar71._0_4_ = IVar59.x;
          auVar71._4_4_ = IVar59.y;
          IVar58 = (pIVar52->IO).MousePos;
          IVar60.x = (pIVar33->Pos).x;
          fVar68 = (pIVar33->Pos).y;
          auVar72._0_4_ = (IVar58.x - IVar60.x) * (1.0 - fVar64) * IVar59.x;
          auVar72._4_4_ = (IVar58.y - fVar68) * (1.0 - fVar64) * IVar59.y;
          auVar72._8_8_ = 0;
          auVar70 = divps(auVar72,auVar71);
          local_98._4_4_ = auVar70._4_4_ + fVar68;
          local_98._0_4_ = auVar70._0_4_ + IVar60.x;
          IStack_90 = IVar74.Max;
          SetWindowPos(pIVar33,(ImVec2 *)local_98,0);
          IVar60 = pIVar33->SizeFull;
          IVar61.x = (float)(int)((pIVar33->Size).x * fVar64);
          IVar61.y = (float)(int)((pIVar33->Size).y * fVar64);
          pIVar33->Size = IVar61;
          (pIVar33->SizeFull).x = (float)(int)(IVar60.x * fVar64);
          (pIVar33->SizeFull).y = (float)(int)(IVar60.y * fVar64);
        }
      }
      goto LAB_001c05bf;
    }
    pIVar40 = pIVar33;
    if ((pIVar52->IO).KeyShift != false) {
      bVar41 = (pIVar52->IO).ConfigMacOSXBehaviors;
      if (bVar41 == false) {
        fVar68 = fVar64;
      }
      if (fVar64 == 0.0 || bVar41 != true) goto LAB_001c0c34;
    }
    while ((uVar54 = pIVar40->Flags, (uVar54 >> 0x18 & 1) != 0 &&
           (((uVar54 & 0x210) == 0x10 ||
            ((fVar68 = (pIVar40->ScrollMax).y, fVar68 == 0.0 && (!NAN(fVar68)))))))) {
      pIVar40 = pIVar40->ParentWindow;
    }
    fVar68 = IVar60.x;
    if ((uVar54 & 0x210) == 0) {
      LockWheelingWindow(pIVar33,fVar64);
      fVar57 = ((pIVar40->InnerRect).Max.y - (pIVar40->InnerRect).Min.y) * 0.67;
      fVar73 = ImGuiWindow::CalcFontSize(pIVar40);
      fVar68 = fVar73 * 5.0;
      if (fVar57 <= fVar73 * 5.0) {
        fVar68 = fVar57;
      }
      (pIVar40->ScrollTarget).y = (pIVar40->Scroll).y - (float)(int)fVar68 * fVar64;
      (pIVar40->ScrollTargetCenterRatio).y = 0.0;
      (pIVar40->ScrollTargetEdgeSnapDist).y = 0.0;
      fVar68 = IVar60.x;
    }
  }
  else {
    if ((bVar41 & 1U) != 0) goto LAB_001c05bf;
    if (((pIVar52->IO).KeyShift == true) && ((pIVar52->IO).ConfigMacOSXBehaviors == false)) {
      fVar68 = fVar64;
    }
  }
LAB_001c0c34:
  pIVar40 = pIVar33;
  if ((fVar68 != 0.0) || (NAN(fVar68))) {
    while ((uVar54 = pIVar40->Flags, (uVar54 >> 0x18 & 1) != 0 &&
           (((uVar54 & 0x210) == 0x10 ||
            ((IVar60.x = (pIVar40->ScrollMax).x, IVar60.x == 0.0 && (!NAN(IVar60.x)))))))) {
      pIVar40 = pIVar40->ParentWindow;
    }
    if ((uVar54 & 0x210) == 0) {
      LockWheelingWindow(pIVar33,fVar68);
      fVar64 = ((pIVar40->InnerRect).Max.x - (pIVar40->InnerRect).Min.x) * 0.67;
      fVar57 = ImGuiWindow::CalcFontSize(pIVar40);
      IVar60.x = fVar57 + fVar57;
      if (fVar64 <= fVar57 + fVar57) {
        IVar60.x = fVar64;
      }
      (pIVar40->ScrollTarget).x = (pIVar40->Scroll).x - (float)(int)IVar60.x * fVar68;
      (pIVar40->ScrollTargetCenterRatio).x = 0.0;
      (pIVar40->ScrollTargetEdgeSnapDist).x = 0.0;
    }
  }
LAB_001c05bf:
  local_d8 = 3.4028235e+38;
  if ((ctx->GcCompactAll == false) &&
     (IVar60.x = (ctx->IO).ConfigMemoryCompactTimer, 0.0 <= IVar60.x)) {
    local_d8 = (float)ctx->Time - IVar60.x;
  }
  for (uVar39 = 0; uVar39 != (uint)(ctx->Windows).Size; uVar39 = uVar39 + 1) {
    pIVar33 = (ctx->Windows).Data[uVar39];
    bVar41 = pIVar33->Active;
    pIVar33->WasActive = bVar41;
    pIVar33->Active = false;
    pIVar33->WriteAccessed = false;
    pIVar33->BeginCountPreviousFrame = pIVar33->BeginCount;
    pIVar33->BeginCount = 0;
    if (((bVar41 == false) && (pIVar33->MemoryCompacted == false)) &&
       (pIVar33->LastTimeActive <= local_d8 && local_d8 != pIVar33->LastTimeActive)) {
      GcCompactTransientWindowBuffers(pIVar33);
    }
  }
  lVar43 = 0;
  for (lVar38 = 0; lVar38 < (ctx->TablesLastTimeActive).Size; lVar38 = lVar38 + 1) {
    IVar60.x = (ctx->TablesLastTimeActive).Data[lVar38];
    if ((0.0 <= IVar60.x) && (IVar60.x < local_d8)) {
      TableGcCompactTransientBuffers((ImGuiTable *)((long)&((ctx->Tables).Buf.Data)->ID + lVar43));
    }
    lVar43 = lVar43 + 0x218;
  }
  lVar43 = 0;
  for (lVar38 = 0; lVar38 < (ctx->TablesTempData).Size; lVar38 = lVar38 + 1) {
    pIVar10 = (ctx->TablesTempData).Data;
    IVar60.x = *(float *)((long)&pIVar10->LastTimeActive + lVar43);
    if ((0.0 <= IVar60.x) && (IVar60.x < local_d8)) {
      TableGcCompactTransientBuffers((ImGuiTableTempData *)((long)&pIVar10->TableIndex + lVar43));
    }
    lVar43 = lVar43 + 0x70;
  }
  if (ctx->GcCompactAll != false) {
    GcCompactTransientMiscBuffers();
  }
  ctx->GcCompactAll = false;
  if ((ctx->NavWindow != (ImGuiWindow *)0x0) && (ctx->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  ImVector<ImGuiWindowStackData>::resize(&ctx->CurrentWindowStack,0);
  ImVector<ImGuiPopupData>::resize(&ctx->BeginPopupStack,0);
  ImVector<int>::resize(&ctx->ItemFlagsStack,0);
  auVar16._12_4_ = 0;
  auVar16._0_12_ = stack0xffffffffffffff6c;
  _local_98 = (ImRect)(auVar16 << 0x20);
  ImVector<int>::push_back(&ctx->ItemFlagsStack,(int *)local_98);
  ImVector<ImGuiGroupData>::resize(&ctx->GroupStack,0);
  pIVar52 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar52->DebugItemPickerActive == true) {
    IVar24 = pIVar52->HoveredIdPreviousFrame;
    pIVar52->MouseCursor = 7;
    bVar41 = IsKeyPressed(ImGuiKey_Escape,true);
    if (bVar41) {
      pIVar52->DebugItemPickerActive = false;
    }
    iVar35 = (pIVar52->IO).KeyMods;
    if ((iVar35 != 0x3000) &&
       (bVar41 = IsMouseClicked((uint)pIVar52->DebugItemPickerMouseButton,false),
       IVar24 != 0 && bVar41)) {
      pIVar52->DebugItemPickerBreakId = IVar24;
      pIVar52->DebugItemPickerActive = false;
    }
    for (iVar56 = 0; pIVar17 = GImGui, iVar56 != 3; iVar56 = iVar56 + 1) {
      if ((iVar35 == 0x3000) && (bVar41 = IsMouseClicked(iVar56,false), bVar41)) {
        pIVar52->DebugItemPickerMouseButton = (ImU8)iVar56;
      }
    }
    (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 0x40;
    (pIVar17->NextWindowData).BgAlphaVal = 0.7;
    BeginTooltip();
    Text("HoveredId: 0x%08X");
    Text("Press ESC to abort picking.");
    if (iVar35 == 0x3000) {
      Text("Remap w/ Ctrl+Shift: click anywhere to select new mouse button.");
    }
    else {
      TextColored((GImGui->Style).Colors + (IVar24 == 0),
                  "Click %s Button to break in debugger! (remap w/ Ctrl+Shift)",
                  &DAT_00224c2c +
                  *(int *)(&DAT_00224c2c + (ulong)pIVar52->DebugItemPickerMouseButton * 4));
    }
    End();
    pIVar52 = GImGui;
  }
  pIVar52->DebugHookIdInfo = 0;
  if (pIVar52->FrameCount == (pIVar52->DebugStackTool).LastActiveFrame + 1) {
    IVar24 = pIVar52->HoveredIdPreviousFrame;
    if (IVar24 == 0) {
      IVar24 = pIVar52->ActiveId;
    }
    if ((pIVar52->DebugStackTool).QueryId != IVar24) {
      (pIVar52->DebugStackTool).QueryId = IVar24;
      (pIVar52->DebugStackTool).StackLevel = -1;
      ImVector<ImGuiStackLevelInfo>::resize(&(pIVar52->DebugStackTool).Results,0);
    }
    if (IVar24 != 0) {
      uVar54 = (pIVar52->DebugStackTool).StackLevel;
      lVar43 = (long)(int)uVar54;
      if (lVar43 < 0) {
        if (uVar54 == 0xffffffff) {
          pIVar52->DebugHookIdInfo = IVar24;
        }
      }
      else {
        iVar35 = (pIVar52->DebugStackTool).Results.Size;
        if ((int)uVar54 < iVar35) {
          pIVar11 = (pIVar52->DebugStackTool).Results.Data;
          if ((pIVar11[lVar43].QuerySuccess != false) || ('\x02' < pIVar11[lVar43].QueryFrameCount))
          {
            uVar54 = uVar54 + 1;
            (pIVar52->DebugStackTool).StackLevel = uVar54;
          }
        }
        if ((int)uVar54 < iVar35) {
          pIVar11 = (pIVar52->DebugStackTool).Results.Data;
          pIVar52->DebugHookIdInfo = pIVar11[uVar54].ID;
          pIVar1 = &pIVar11[uVar54].QueryFrameCount;
          *pIVar1 = *pIVar1 + '\x01';
        }
      }
    }
  }
  if ((ctx->DebugLocateFrames != '\0') &&
     (IVar23 = ctx->DebugLocateFrames + 0xff, ctx->DebugLocateFrames = IVar23, IVar23 == '\0')) {
    ctx->DebugLocateId = 0;
  }
  ctx->WithinFrameScopeWithImplicitWindow = true;
  pIVar52 = GImGui;
  (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
  (pIVar52->NextWindowData).SizeVal.x = 400.0;
  (pIVar52->NextWindowData).SizeVal.y = 400.0;
  (pIVar52->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  CallContextHooks(ctx,ImGuiContextHookType_NewFramePost);
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.FramerateSecPerFrameCount = ImMin(g.FramerateSecPerFrameCount + 1, IM_ARRAYSIZE(g.FramerateSecPerFrame));
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)g.FramerateSecPerFrameCount)) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleTessellationMaxError(g.Style.CircleTessellationMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdDisabled = false;

    // Clear ActiveID if the item is not alive anymore.
    // In 1.87, the common most call to KeepAliveID() was moved from GetID() to ItemAdd().
    // As a result, custom widget using ButtonBehavior() _without_ ItemAdd() need to call KeepAliveID() themselves.
    if (g.ActiveId != 0 && g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId)
    {
        IMGUI_DEBUG_LOG_ACTIVEID("NewFrame(): ClearActiveID() because it isn't marked alive anymore!\n");
        ClearActiveID();
    }

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingAllKeyboardKeys = false;
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
        g.ActiveIdUsingNavInputMask = 0x00;
#endif
    }

#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    if (g.ActiveId == 0)
        g.ActiveIdUsingNavInputMask = 0;
    else if (g.ActiveIdUsingNavInputMask != 0)
    {
        // If your custom widget code used:                 { g.ActiveIdUsingNavInputMask |= (1 << ImGuiNavInput_Cancel); }
        // Since IMGUI_VERSION_NUM >= 18804 it should be:   { SetKeyOwner(ImGuiKey_Escape, g.ActiveId); SetKeyOwner(ImGuiKey_NavGamepadCancel, g.ActiveId); }
        if (g.ActiveIdUsingNavInputMask & (1 << ImGuiNavInput_Cancel))
            SetKeyOwner(ImGuiKey_Escape, g.ActiveId);
        if (g.ActiveIdUsingNavInputMask & ~(1 << ImGuiNavInput_Cancel))
            IM_ASSERT(0); // Other values unsupported
    }
#endif

    // Update hover delay for IsItemHovered() with delays and tooltips
    g.HoverDelayIdPreviousFrame = g.HoverDelayId;
    if (g.HoverDelayId != 0)
    {
        //if (g.IO.MouseDelta.x == 0.0f && g.IO.MouseDelta.y == 0.0f) // Need design/flags
        g.HoverDelayTimer += g.IO.DeltaTime;
        g.HoverDelayClearTimer = 0.0f;
        g.HoverDelayId = 0;
    }
    else if (g.HoverDelayTimer > 0.0f)
    {
        // This gives a little bit of leeway before clearing the hover timer, allowing mouse to cross gaps
        g.HoverDelayClearTimer += g.IO.DeltaTime;
        if (g.HoverDelayClearTimer >= ImMax(0.20f, g.IO.DeltaTime * 2.0f)) // ~6 frames at 30 Hz + allow for low framerate
            g.HoverDelayTimer = g.HoverDelayClearTimer = 0.0f; // May want a decaying timer, in which case need to clamp at max first, based on max of caller last requested timer.
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Close popups on focus lost (currently wip/opt-in)
    //if (g.IO.AppFocusLost)
    //    ClosePopupsExceptModals();

    // Process input queue (trickle as many events as possible)
    g.InputEventsTrail.resize(0);
    UpdateInputEvents(g.IO.ConfigInputTrickleEventQueue);

    // Update keyboard input state
    UpdateKeyboardInputs();

    //IM_ASSERT(g.IO.KeyCtrl == IsKeyDown(ImGuiKey_LeftCtrl) || IsKeyDown(ImGuiKey_RightCtrl));
    //IM_ASSERT(g.IO.KeyShift == IsKeyDown(ImGuiKey_LeftShift) || IsKeyDown(ImGuiKey_RightShift));
    //IM_ASSERT(g.IO.KeyAlt == IsKeyDown(ImGuiKey_LeftAlt) || IsKeyDown(ImGuiKey_RightAlt));
    //IM_ASSERT(g.IO.KeySuper == IsKeyDown(ImGuiKey_LeftSuper) || IsKeyDown(ImGuiKey_RightSuper));

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;

    // Platform IME data: reset for the frame
    g.PlatformImeDataPrev = g.PlatformImeData;
    g.PlatformImeData.WantVisible = false;

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size <= g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->Active = false;
        window->WriteAccessed = false;
        window->BeginCountPreviousFrame = window->BeginCount;
        window->BeginCount = 0;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    for (int i = 0; i < g.TablesTempData.Size; i++)
        if (g.TablesTempData[i].LastTimeActive >= 0.0f && g.TablesTempData[i].LastTimeActive < memory_compact_start_time)
            TableGcCompactTransientBuffers(&g.TablesTempData[i]);
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_None);
    g.GroupStack.resize(0);

    // [DEBUG] Update debug features
    UpdateDebugToolItemPicker();
    UpdateDebugToolStackQueries();
    if (g.DebugLocateFrames > 0 && --g.DebugLocateFrames == 0)
        g.DebugLocateId = 0;

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it prevents ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}